

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidSliceStaticNoParams(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<bool> *this;
  uint uVar2;
  Rep *pRVar3;
  ulong uVar4;
  bool bVar5;
  FeatureType *pFVar6;
  long *plVar7;
  FeatureDescription *pFVar8;
  ArrayFeatureType *pAVar9;
  NeuralNetworkLayer *pNVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  void *pvVar12;
  LayerUnion this_00;
  bool *pbVar13;
  ostream *poVar14;
  string *psVar15;
  long lVar16;
  undefined8 *puVar17;
  int iVar18;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar19;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_01;
  Arena *pAVar20;
  uint uVar21;
  Model m;
  Result res5;
  Result res4;
  Result res3;
  Result res2;
  Result res1;
  Model local_120;
  Result local_f0;
  Result local_c8;
  Result local_a0;
  Result local_78;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_120,(Arena *)0x0,false);
  if (local_120.description_ == (ModelDescription *)0x0) {
    pAVar20 = (Arena *)(local_120.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_120.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    local_120.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar20);
  }
  pRVar3 = ((local_120.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_0019397d:
    pRVar19 = &(local_120.description_)->input_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar18 = ((local_120.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_0019397d;
    ((local_120.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"input",puVar17);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  if (uVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  uVar21 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar21;
  if (uVar21 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 2);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 5;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 5;
  }
  uVar21 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar21;
  if (uVar21 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 3);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 2;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 2;
  }
  pRVar1->current_size_ = uVar2 + 3;
  if (local_120.description_ == (ModelDescription *)0x0) {
    pAVar20 = (Arena *)(local_120.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_120.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    local_120.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar20);
  }
  pRVar3 = ((local_120.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00193b3a:
    pRVar19 = &(local_120.description_)->output_;
    pFVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar19->super_RepeatedPtrFieldBase).arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar19->super_RepeatedPtrFieldBase,pFVar8);
  }
  else {
    iVar18 = ((local_120.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_00193b3a;
    ((local_120.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  puVar17 = (undefined8 *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
    puVar17 = (undefined8 *)*puVar17;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar12 + 0x10),"output",puVar17);
  pFVar6 = *(FeatureType **)((long)pvVar12 + 0x20);
  if (pFVar6 == (FeatureType *)0x0) {
    pAVar20 = (Arena *)(*(ulong *)((long)pvVar12 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar12 + 8) & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pFVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar20);
    *(FeatureType **)((long)pvVar12 + 0x20) = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    uVar4 = (pFVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar20);
    (pFVar6->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  uVar2 = (pAVar9->shape_).current_size_;
  if (uVar2 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar2] = 3;
  }
  uVar21 = uVar2 + 1;
  (pAVar9->shape_).current_size_ = uVar21;
  if (uVar21 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 2);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 5;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 5;
  }
  uVar21 = uVar2 + 2;
  (pAVar9->shape_).current_size_ = uVar21;
  if (uVar21 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 3);
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 2;
  }
  else {
    plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar7[uVar21] = 2;
  }
  pRVar1->current_size_ = uVar2 + 3;
  if (local_120._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_120);
    local_120._oneof_case_[0] = 500;
    pAVar20 = (Arena *)(local_120.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_120.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    local_120.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar20);
  }
  (local_120.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar3 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_120.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00193d17:
    this_01 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_120.Type_.pipeline_)->models_;
    pNVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_01->super_RepeatedPtrFieldBase).arena_);
    pNVar10 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_01,pNVar10);
  }
  else {
    iVar18 = (local_120.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_00193d17;
    (local_120.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar18 + 1;
    pNVar10 = (NeuralNetworkLayer *)pRVar3->elements[iVar18];
  }
  pRVar3 = (pNVar10->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00193d50:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->input_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar18 = (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_00193d50;
    (pNVar10->input_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3a8ef3);
  pRVar3 = (pNVar10->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 == (Rep *)0x0) {
LAB_00193da1:
    pbVar11 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar10->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar12 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar10->output_).super_RepeatedPtrFieldBase,pbVar11);
  }
  else {
    iVar18 = (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar3->allocated_size <= iVar18) goto LAB_00193da1;
    (pNVar10->output_).super_RepeatedPtrFieldBase.current_size_ = iVar18 + 1;
    pvVar12 = pRVar3->elements[iVar18];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar12,0,*(char **)((long)pvVar12 + 8),0x3bbdaf);
  if (pNVar10->_oneof_case_[0] == 0x3e3) {
    this_00 = pNVar10->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar10);
    pNVar10->_oneof_case_[0] = 0x3e3;
    uVar4 = (pNVar10->super_MessageLite)._internal_metadata_.ptr_;
    pAVar20 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar20 = *(Arena **)pAVar20;
    }
    this_00.slicestatic_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SliceStaticLayerParams>
                   (pAVar20);
    (pNVar10->layer_).slicestatic_ = (SliceStaticLayerParams *)this_00;
  }
  this = &(this_00.slicestatic_)->endmasks_;
  uVar2 = ((this_00.slicestatic_)->endmasks_).current_size_;
  if (uVar2 == (this_00.pooling_)->_oneof_case_[0]) {
    google::protobuf::RepeatedField<bool>::Reserve(this,uVar2 + 1);
    pbVar13 = google::protobuf::RepeatedField<bool>::elements(this);
    pbVar13[uVar2] = true;
  }
  else {
    pbVar13 = google::protobuf::RepeatedField<bool>::elements(this);
    pbVar13[uVar2] = true;
  }
  this->current_size_ = uVar2 + 1;
  CoreML::validate<(MLModelType)500>(&local_50,&local_120);
  bVar5 = CoreML::Result::good(&local_50);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x157a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  }
  else {
    psVar15 = CoreML::Result::message_abi_cxx11_(&local_50);
    lVar16 = std::__cxx11::string::find((char *)psVar15,0x397e5c,0);
    if (lVar16 != -1) {
      pRVar1 = &(this_00.reshape_)->targetshape_;
      uVar2 = ((RepeatedField<long> *)&(this_00.convolution_)->kernelsize_)->current_size_;
      if (uVar2 == ((RepeatedField<long> *)&(this_00.convolution_)->kernelsize_)->total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
        plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
        plVar7[uVar2] = 0;
      }
      else {
        plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
        plVar7[uVar2] = 0;
      }
      pRVar1->current_size_ = uVar2 + 1;
      CoreML::validate<(MLModelType)500>(&local_78,&local_120);
      bVar5 = CoreML::Result::good(&local_78);
      if (bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1580);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res2).good())",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
LAB_001941f8:
        std::ostream::put((char)poVar14);
        iVar18 = 1;
        std::ostream::flush();
      }
      else {
        psVar15 = CoreML::Result::message_abi_cxx11_(&local_78);
        lVar16 = std::__cxx11::string::find((char *)psVar15,0x397ead,0);
        if (lVar16 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x68);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1581);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14,"res2.message().find(\"End IDs\") != std::string::npos",0x33);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
          goto LAB_001941f8;
        }
        pRVar1 = &(this_00.slicestatic_)->endids_;
        uVar2 = ((RepeatedField<long> *)&(this_00.upsample_)->mode_)->current_size_;
        if (uVar2 == (this_00.pooling_)->type_) {
          google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
          plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
          plVar7[uVar2] = 5;
        }
        else {
          plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
          plVar7[uVar2] = 5;
        }
        pRVar1->current_size_ = uVar2 + 1;
        CoreML::validate<(MLModelType)500>(&local_a0,&local_120);
        bVar5 = CoreML::Result::good(&local_a0);
        if (bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x68);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1586);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res3).good())",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
          std::ostream::put((char)poVar14);
          iVar18 = 1;
          std::ostream::flush();
        }
        else {
          psVar15 = CoreML::Result::message_abi_cxx11_(&local_a0);
          lVar16 = std::__cxx11::string::find((char *)psVar15,0x397efa,0);
          if (lVar16 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                       ,0x68);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1587);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,"res3.message().find(\"Strides\") != std::string::npos",0x33);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14," was false, expected true.",0x1a);
            iVar18 = 1;
            std::endl<char,std::char_traits<char>>(poVar14);
          }
          else {
            pRVar1 = &(this_00.slicestatic_)->strides_;
            uVar2 = *(uint *)&((this_00.convolution_)->outputshape_).arena_or_elements_;
            if (uVar2 == *(uint *)((long)&((this_00.convolution_)->outputshape_).arena_or_elements_
                                  + 4)) {
              google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar2 + 1);
              plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
              plVar7[uVar2] = 1;
            }
            else {
              plVar7 = google::protobuf::RepeatedField<long>::elements(pRVar1);
              plVar7[uVar2] = 1;
            }
            pRVar1->current_size_ = uVar2 + 1;
            CoreML::validate<(MLModelType)500>(&local_c8,&local_120);
            bVar5 = CoreML::Result::good(&local_c8);
            if (bVar5) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                         ,0x68);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x158c);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res4).good())",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14," was false, expected true.",0x1a);
LAB_00194618:
              iVar18 = 1;
              std::endl<char,std::char_traits<char>>(poVar14);
            }
            else {
              psVar15 = CoreML::Result::message_abi_cxx11_(&local_c8);
              lVar16 = std::__cxx11::string::find((char *)psVar15,0x397f47,0);
              if (lVar16 == -1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                           ,0x68);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x158d);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,"res4.message().find(\"Begin masks\") != std::string::npos",0x37)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14," was false, expected true.",0x1a);
                goto LAB_00194618;
              }
              CoreML::Specification::SliceStaticLayerParams::add_beginmasks
                        (this_00.slicestatic_,true);
              this->current_size_ = 0;
              CoreML::validate<(MLModelType)500>(&local_f0,&local_120);
              bVar5 = CoreML::Result::good(&local_f0);
              if (bVar5) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                           ,0x68);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1593);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!((res5).good())",0x10);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14," was false, expected true.",0x1a);
LAB_001946d6:
                iVar18 = 1;
                std::endl<char,std::char_traits<char>>(poVar14);
              }
              else {
                psVar15 = CoreML::Result::message_abi_cxx11_(&local_f0);
                iVar18 = 0;
                lVar16 = std::__cxx11::string::find((char *)psVar15,0x397f9c,0);
                if (lVar16 == -1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             ,0x68);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                  poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1594);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14,"res5.message().find(\"End masks\") != std::string::npos",0x35)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14," was false, expected true.",0x1a);
                  goto LAB_001946d6;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0.m_message._M_dataplus._M_p != &local_f0.m_message.field_2) {
                operator_delete(local_f0.m_message._M_dataplus._M_p,
                                local_f0.m_message.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8.m_message._M_dataplus._M_p != &local_c8.m_message.field_2) {
              operator_delete(local_c8.m_message._M_dataplus._M_p,
                              local_c8.m_message.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.m_message._M_dataplus._M_p != &local_a0.m_message.field_2) {
          operator_delete(local_a0.m_message._M_dataplus._M_p,
                          local_a0.m_message.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.m_message._M_dataplus._M_p != &local_78.m_message.field_2) {
        operator_delete(local_78.m_message._M_dataplus._M_p,
                        local_78.m_message.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0019475b;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x157b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"res1.message().find(\"Begin IDs\") != std::string::npos",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  }
  std::ostream::put((char)poVar14);
  iVar18 = 1;
  std::ostream::flush();
LAB_0019475b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_120);
  return iVar18;
}

Assistant:

int testInvalidSliceStaticNoParams() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // missing required parameters

    auto* params = layers->mutable_slicestatic();
    params->add_endmasks(true);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("Begin IDs") != std::string::npos);

    params->add_beginids(0);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("End IDs") != std::string::npos);

    params->add_endids(5);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("Strides") != std::string::npos);

    params->add_strides(1);

    Result res4 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res4);
    ML_ASSERT(res4.message().find("Begin masks") != std::string::npos);

    params->add_beginmasks(true);
    params->clear_endmasks();

    Result res5 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res5);
    ML_ASSERT(res5.message().find("End masks") != std::string::npos);

    return 0;

}